

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

void __thiscall
CConnman::NodesSnapshot::NodesSnapshot(NodesSnapshot *this,CConnman *connman,bool shuffle)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *pszFile;
  byte in_DL;
  FastRandomContext *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CNode **node;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range2;
  iterator __end2;
  iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  CNode *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  *in_stack_fffffffffffffee8;
  char *in_stack_ffffffffffffff08;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff10;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff18;
  vector<CNode_*,_std::allocator<CNode_*>_> *in_stack_ffffffffffffff70;
  vector<CNode_*,_std::allocator<CNode_*>_> *in_stack_ffffffffffffff78;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffed8);
  pszFile = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (char *)pszFile,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::operator=
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  while( true ) {
    bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                      (in_stack_fffffffffffffee8,
                       (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
              in_stack_fffffffffffffed8);
    CNode::AddRef(in_stack_fffffffffffffed8);
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               in_stack_fffffffffffffed8);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffed8);
  if ((in_DL & 1) != 0) {
    std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::vector<CNode_*,_std::allocator<CNode_*>_>::end
              ((vector<CNode_*,_std::allocator<CNode_*>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)&stack0xffffffffffffff70,(bool)in_stack_fffffffffffffee7);
    std::
    shuffle<__gnu_cxx::__normal_iterator<CNode**,std::vector<CNode*,std::allocator<CNode*>>>,FastRandomContext>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RSI);
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffffed8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit NodesSnapshot(const CConnman& connman, bool shuffle)
        {
            {
                LOCK(connman.m_nodes_mutex);
                m_nodes_copy = connman.m_nodes;
                for (auto& node : m_nodes_copy) {
                    node->AddRef();
                }
            }
            if (shuffle) {
                std::shuffle(m_nodes_copy.begin(), m_nodes_copy.end(), FastRandomContext{});
            }
        }